

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::ClosePopupsOverWindow(ImGuiWindow *ref_window)

{
  bool bVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  value_type *pvVar4;
  int local_30;
  int m;
  bool has_focus;
  ImGuiPopupRef *popup;
  int n;
  ImGuiContext *g;
  ImGuiWindow *ref_window_local;
  
  pIVar2 = GImGui;
  bVar3 = ImVector<ImGuiPopupRef>::empty(&GImGui->OpenPopupStack);
  if (!bVar3) {
    popup._4_4_ = 0;
    if (ref_window != (ImGuiWindow *)0x0) {
      for (popup._4_4_ = 0; popup._4_4_ < (pIVar2->OpenPopupStack).Size;
          popup._4_4_ = popup._4_4_ + 1) {
        pvVar4 = ImVector<ImGuiPopupRef>::operator[](&pIVar2->OpenPopupStack,popup._4_4_);
        if (pvVar4->Window != (ImGuiWindow *)0x0) {
          if ((pvVar4->Window->Flags & 0x4000000U) == 0) {
            __assert_fail("(popup.Window->Flags & ImGuiWindowFlags_Popup) != 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                          ,0x1375,"void ImGui::ClosePopupsOverWindow(ImGuiWindow *)");
          }
          if ((pvVar4->Window->Flags & 0x1000000U) == 0) {
            bVar3 = false;
            local_30 = popup._4_4_;
            while( true ) {
              bVar1 = false;
              if (local_30 < (pIVar2->OpenPopupStack).Size) {
                bVar1 = (bool)(bVar3 ^ 1);
              }
              if (!bVar1) break;
              pvVar4 = ImVector<ImGuiPopupRef>::operator[](&pIVar2->OpenPopupStack,local_30);
              bVar3 = false;
              if (pvVar4->Window != (ImGuiWindow *)0x0) {
                pvVar4 = ImVector<ImGuiPopupRef>::operator[](&pIVar2->OpenPopupStack,local_30);
                bVar3 = pvVar4->Window->RootWindow == ref_window->RootWindow;
              }
              local_30 = local_30 + 1;
            }
            if (!bVar3) break;
          }
        }
      }
    }
    if (popup._4_4_ < (pIVar2->OpenPopupStack).Size) {
      ClosePopupToLevel(popup._4_4_);
    }
  }
  return;
}

Assistant:

void ImGui::ClosePopupsOverWindow(ImGuiWindow* ref_window)
{
    ImGuiContext& g = *GImGui;
    if (g.OpenPopupStack.empty())
        return;

    // When popups are stacked, clicking on a lower level popups puts focus back to it and close popups above it.
    // Don't close our own child popup windows.
    int n = 0;
    if (ref_window)
    {
        for (n = 0; n < g.OpenPopupStack.Size; n++)
        {
            ImGuiPopupRef& popup = g.OpenPopupStack[n];
            if (!popup.Window)
                continue;
            IM_ASSERT((popup.Window->Flags & ImGuiWindowFlags_Popup) != 0);
            if (popup.Window->Flags & ImGuiWindowFlags_ChildWindow)
                continue;

            // Trim the stack if popups are not direct descendant of the reference window (which is often the NavWindow)
            bool has_focus = false;
            for (int m = n; m < g.OpenPopupStack.Size && !has_focus; m++)
                has_focus = (g.OpenPopupStack[m].Window && g.OpenPopupStack[m].Window->RootWindow == ref_window->RootWindow);
            if (!has_focus)
                break;
        }
    }
    if (n < g.OpenPopupStack.Size) // This test is not required but it allows to set a convenient breakpoint on the block below
        ClosePopupToLevel(n);
}